

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ZSTD_CCtx_params *params,
                 void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,void *workspace)

{
  U32 *src;
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  U32 *pUVar6;
  ulong srcSize;
  void *pvVar7;
  U32 *pUVar8;
  uint matchlengthMaxValue;
  uint offcodeMaxValue;
  size_t local_108;
  ZSTD_matchState_t *local_100;
  uint matchlengthLog;
  size_t local_f0;
  uint maxSymbolValue;
  short offcodeNCount [32];
  
  if (8 < dictSize && dict != (void *)0x0) {
    local_100 = ms;
    ZSTD_reset_compressedBlockState(bs);
    if (dictContentType != ZSTD_dct_rawContent) {
      if (*dict == -0x13cf5bc9) {
LAB_003b6b4b:
        offcodeMaxValue = 0x1f;
        if ((params->fParams).noDictIDFlag == 0) {
          local_f0 = (size_t)*(uint *)((long)dict + 4);
        }
        else {
          local_f0 = 0;
        }
        maxSymbolValue = 0xff;
        sVar2 = HUF_readCTable((HUF_CElt *)bs,&maxSymbolValue,(void *)((long)dict + 8),dictSize - 8)
        ;
        if (maxSymbolValue < 0xff || 0xffffffffffffff88 < sVar2) {
          return 0xffffffffffffffe2;
        }
        pUVar6 = (U32 *)(dictSize + (long)dict);
        pvVar7 = (void *)((long)dict + sVar2 + 8);
        sVar2 = FSE_readNCount(offcodeNCount,&offcodeMaxValue,&maxSymbolValue,pvVar7,
                               (long)pUVar6 - (long)pvVar7);
        if (0xffffffffffffff88 < sVar2) {
          return 0xffffffffffffffe2;
        }
        if (8 < maxSymbolValue) {
          return 0xffffffffffffffe2;
        }
        sVar3 = FSE_buildCTable_wksp
                          ((bs->entropy).fse.offcodeCTable,offcodeNCount,0x1f,maxSymbolValue,
                           workspace,0x1800);
        if (0xffffffffffffff88 < sVar3) {
          return 0xffffffffffffffe2;
        }
        pvVar7 = (void *)((long)pvVar7 + sVar2);
        matchlengthMaxValue = 0x34;
        local_108 = FSE_readNCount((short *)&maxSymbolValue,&matchlengthMaxValue,&matchlengthLog,
                                   pvVar7,(long)pUVar6 - (long)pvVar7);
        uVar5 = matchlengthLog;
        uVar1 = matchlengthMaxValue;
        if (matchlengthLog < 10 && local_108 < 0xffffffffffffff89) {
          sVar2 = ZSTD_checkDictNCount((short *)&maxSymbolValue,matchlengthMaxValue,0x34);
          if (0xffffffffffffff88 < sVar2) {
            return sVar2;
          }
          sVar2 = FSE_buildCTable_wksp
                            ((bs->entropy).fse.matchlengthCTable,(short *)&maxSymbolValue,uVar1,
                             uVar5,workspace,0x1800);
          if (sVar2 < 0xffffffffffffff89) {
            pvVar7 = (void *)((long)pvVar7 + local_108);
            matchlengthMaxValue = 0x23;
            local_108 = FSE_readNCount((short *)&maxSymbolValue,&matchlengthMaxValue,&matchlengthLog
                                       ,pvVar7,(long)pUVar6 - (long)pvVar7);
            uVar1 = matchlengthMaxValue;
            if (matchlengthLog < 10 && local_108 < 0xffffffffffffff89) {
              sVar2 = ZSTD_checkDictNCount((short *)&maxSymbolValue,matchlengthMaxValue,0x23);
              if (0xffffffffffffff88 < sVar2) {
                return sVar2;
              }
              sVar2 = FSE_buildCTable_wksp
                                ((bs->entropy).fse.litlengthCTable,(short *)&maxSymbolValue,uVar1,
                                 matchlengthLog,workspace,0x1800);
              if (0xffffffffffffff88 < sVar2) {
                return 0xffffffffffffffe2;
              }
              pUVar8 = (U32 *)((long)pvVar7 + local_108);
              src = pUVar8 + 3;
              if (pUVar6 < src) {
                return 0xffffffffffffffe2;
              }
              bs->rep[0] = *pUVar8;
              bs->rep[1] = pUVar8[1];
              bs->rep[2] = pUVar8[2];
              srcSize = (long)pUVar6 - (long)src;
              uVar5 = (int)srcSize + 0x20000;
              uVar1 = 0x1f;
              if (uVar5 != 0) {
                for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
                }
              }
              uVar5 = 0x1f;
              if (srcSize >> 0x11 < 0x7fff) {
                uVar5 = uVar1;
              }
              sVar2 = ZSTD_checkDictNCount(offcodeNCount,offcodeMaxValue,uVar5);
              if (sVar2 < 0xffffffffffffff89) {
                lVar4 = 0;
                while( true ) {
                  if (lVar4 == 3) {
                    (bs->entropy).huf.repeatMode = HUF_repeat_valid;
                    (bs->entropy).fse.offcode_repeatMode = FSE_repeat_valid;
                    (bs->entropy).fse.matchlength_repeatMode = FSE_repeat_valid;
                    (bs->entropy).fse.litlength_repeatMode = FSE_repeat_valid;
                    ZSTD_loadDictionaryContent(local_100,params,src,srcSize,dtlm);
                    return local_f0;
                  }
                  pUVar6 = bs->rep + lVar4;
                  if ((ulong)*pUVar6 == 0) break;
                  lVar4 = lVar4 + 1;
                  if (srcSize < *pUVar6) {
                    return 0xffffffffffffffe2;
                  }
                }
                return 0xffffffffffffffe2;
              }
              return sVar2;
            }
          }
        }
        return 0xffffffffffffffe2;
      }
      if (dictContentType == ZSTD_dct_fullDict) {
        return 0xffffffffffffffe0;
      }
      if (dictContentType != ZSTD_dct_auto) goto LAB_003b6b4b;
    }
    ZSTD_loadDictionaryContent(local_100,params,dict,dictSize,dtlm);
  }
  return 0;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<=8)) return 0;

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(ms, params, dict, dictSize, dtlm);
        }
        if (dictContentType == ZSTD_dct_fullDict)
            return ERROR(dictionary_wrong);
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(bs, ms, params, dict, dictSize, dtlm, workspace);
}